

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O2

bool __thiscall asl::HttpMessage::sendHeaders(HttpMessage *this)

{
  KeyVal *pKVar1;
  KeyVal *pKVar2;
  SmartObject_ *pSVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  anon_union_16_2_78e7fdac_for_String_2 *paVar8;
  bool bVar9;
  String s;
  long local_78;
  String contentlength;
  String local_48;
  
  s.field_2._space[0] = '\0';
  s._size = 0;
  s._len = 0;
  String::operator+=(&s,&this->_command);
  String::operator+=(&s,"\r\n");
  uVar7 = 1;
  for (local_78 = 0;
      (uVar7 != 0 &&
      (pKVar1 = (this->_headers).super_Map<asl::String,_asl::String>.a._a,
      local_78 < *(int *)&pKVar1[-1].value.field_2)); local_78 = local_78 + 1) {
    while (0 < (int)uVar7) {
      pKVar2 = (this->_headers).super_Map<asl::String,_asl::String>.a._a;
      while (bVar9 = uVar7 != 0, uVar7 = uVar7 - 1, bVar9) {
        String::operator+=(&s,&pKVar2[local_78].key);
        String::operator+=(&s,": ");
        String::operator+=(&s,&pKVar1[local_78].value);
        String::operator+=(&s,"\r\n");
      }
      uVar7 = 0xfffffffe;
    }
    uVar7 = ~uVar7;
  }
  String::operator+=(&s,"\r\n");
  if (s._size == 0) {
    paVar8 = &s.field_2;
  }
  else {
    paVar8 = (anon_union_16_2_78e7fdac_for_String_2 *)CONCAT71(s.field_2._1_7_,s.field_2._space[0]);
  }
  pSVar3 = (this->_socket->super_SmartObject)._p;
  iVar5 = (*pSVar3->_vptr_SmartObject_[0xe])(pSVar3,paVar8,(ulong)s._0_8_ >> 0x20);
  iVar4 = s._len;
  if (s._len <= iVar5) {
    this->_headersSent = true;
    String::String(&local_48,"Content-Length");
    header(&contentlength,this,&local_48);
    String::~String(&local_48);
    this->_chunked = contentlength._len < 1;
    if (contentlength._len < 1) {
      iVar6 = 0;
    }
    else {
      iVar6 = String::operator_cast_to_int(&contentlength);
    }
    ((this->_status)._p)->p->totalSend = iVar6;
    String::~String(&contentlength);
  }
  String::~String(&s);
  return iVar4 <= iVar5;
}

Assistant:

bool HttpMessage::sendHeaders()
{
	String s;
	s << _command << "\r\n";
	foreach2(String& name, String& value, _headers)
	{
		s << name << ": " << value << "\r\n";
	}
	s << "\r\n";
	int sent = _socket->write(*s, s.length());
	if (sent < s.length())
		return false;
	_headersSent = true;
	String contentlength = header("Content-Length");
	_chunked = !contentlength.ok();
	_status->totalSend = _chunked ? 0 : int(contentlength);
	return true;
}